

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  string buffer;
  string xml;
  Raytracer rt;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  string local_198;
  string local_178;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  string local_138;
  Raytracer local_118;
  
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"example2.xml","");
  local_1b0 = 0;
  local_1a8[0] = 0;
  local_1b8 = local_1a8;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_178,local_158,local_158 + local_150);
  Raytracer::Raytracer(&local_118,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  Raytracer::start_abi_cxx11_(&local_138,&local_118);
  std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_198,local_1b8,local_1b8 + local_1b0);
  Raytracer::writePPM(&local_118,&local_198,(int)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  std::vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>::~vector
            (&local_118.lightsrc);
  std::vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>::~vector
            (&local_118.objects);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.outputname._M_dataplus._M_p != &local_118.outputname.field_2) {
    operator_delete(local_118.outputname._M_dataplus._M_p);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  return 0;
}

Assistant:

int main() {
    std::string xml="example2.xml";
    std::string buffer;
    int imgWidth=512;
    int imgHeight=512;

    Raytracer rt(xml);

    buffer=rt.start();
    rt.writePPM(buffer, buffer.size());

    return 0;
}